

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::Decode(SilentEntitySystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  ushort uVar2;
  allocator<char> local_49;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    std::
    vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>::
    clear(&this->m_vEA);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumEnts);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumOfAppearanceRecords);
    (*(this->m_EntTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntTyp,stream);
    for (uVar2 = 0; uVar2 < this->m_ui16NumOfAppearanceRecords; uVar2 = uVar2 + 1) {
      DATA_TYPE::EntityAppearance::EntityAppearance((EntityAppearance *)&local_48,stream);
      std::
      vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
      ::emplace_back<KDIS::DATA_TYPE::EntityAppearance>(&this->m_vEA,(EntityAppearance *)&local_48);
      DATA_TYPE::EntityAppearance::~EntityAppearance((EntityAppearance *)&local_48);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SilentEntitySystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SILENT_ENTITY_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vEA.clear();

    stream >> m_ui16NumEnts
           >> m_ui16NumOfAppearanceRecords
           >> KDIS_STREAM m_EntTyp;

    for( KUINT16 i = 0; i < m_ui16NumOfAppearanceRecords; ++i )
    {
        m_vEA.push_back( EntityAppearance( stream ) );
    }
}